

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O0

FHubInfo * __thiscall FHubInfo::operator=(FHubInfo *this,wbstartstruct_t *wbs)

{
  wbstartstruct_t *wbs_local;
  FHubInfo *this_local;
  
  this->finished_ep = wbs->finished_ep;
  this->maxkills = wbs->maxkills;
  this->maxsecret = wbs->maxsecret;
  this->maxitems = wbs->maxitems;
  this->maxfrags = wbs->maxfrags;
  memcpy(this->plyr,wbs->plyr,0x1c0);
  return this;
}

Assistant:

FHubInfo &operator=(const wbstartstruct_t &wbs)
	{
		finished_ep = wbs.finished_ep;
		maxkills = wbs.maxkills;
		maxsecret= wbs.maxsecret;
		maxitems = wbs.maxitems;
		maxfrags = wbs.maxfrags;
		memcpy(plyr, wbs.plyr, sizeof(plyr));
		return *this;
	}